

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::transcode_uastc_to_etc2_eac_a8
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  uint32_t j;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint64_t pixels;
  uint32_t i;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint32_t vals [8];
  
  uVar17 = unpacked_src_blk->m_mode;
  if ((ulong)uVar17 - 0x12 < 0xfffffffffffffff6 || (ulong)uVar17 == 8) {
    uVar3 = 0x1dff;
    if (uVar17 == 8) {
      uVar3 = (unpacked_src_blk->m_solid_color).field_0.field_0.a | 0x1d00;
    }
  }
  else {
    uVar3 = 0xff;
    uVar2 = 0;
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      bVar4 = (*block_pixels)[lVar7].field_0.field_0.a;
      if (bVar4 <= uVar3) {
        uVar3 = (ushort)bVar4;
      }
      if (uVar2 <= bVar4) {
        uVar2 = (ushort)bVar4;
      }
    }
    if (uVar3 != uVar2) {
      uVar17 = unpacked_src_blk->m_etc2_hints;
      if (uVar17 < 0x10) {
        __assert_fail("multiplier >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x38ba,
                      "void basist::transcode_uastc_to_etc2_eac_a8(unpacked_uastc_block &, color32 (*)[4], void *)"
                     );
      }
      lVar7 = (ulong)(uVar17 & 0xf) * 8;
      iVar9 = (int)*(char *)((long)&DAT_001ce801 + lVar7 + 2);
      fVar13 = roundf(((float)uVar2 - (float)uVar3) *
                      ((float)-iVar9 / (float)((char)(&DAT_001ce807)[lVar7] - iVar9)) + (float)uVar3
                     );
      *(ushort *)pDst = (ushort)(int)fVar13 & 0xff | (ushort)(uVar17 << 8);
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        uVar6 = (int)(char)(&g_eac_modifier_table)[lVar5 + lVar7] * (uVar17 >> 4) + (int)fVar13;
        uVar14 = (int)~uVar6 >> 0x1f;
        if (uVar6 < 0x100) {
          uVar14 = uVar6;
        }
        vals[lVar5] = uVar14 & 0xff;
      }
      bVar4 = 0x2d;
      pixels = 0;
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        bVar1 = (*block_pixels)[0].field_0.c
                [(ulong)((uint)lVar7 & 0xfffffffc) + (ulong)(((uint)lVar7 & 3) << 4) + 3];
        uVar17 = (uint)bVar1;
        iVar10 = vals[0] - uVar17;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        uVar14 = (int)(vals[1] - uVar17) >> 0x1f;
        uVar6 = (int)(vals[2] - uVar17) >> 0x1f;
        uVar15 = (int)(vals[3] - uVar17) >> 0x1f;
        uVar16 = (int)(vals[4] - uVar17) >> 0x1f;
        uVar14 = ((vals[1] - uVar17 ^ uVar14) - uVar14) * 8 | 1;
        uVar6 = ((vals[2] - uVar17 ^ uVar6) - uVar6) * 8 | 2;
        uVar15 = ((vals[3] - uVar17 ^ uVar15) - uVar15) * 8 | 3;
        uVar16 = ((vals[4] - uVar17 ^ uVar16) - uVar16) * 8 | 4;
        uVar17 = (uint)bVar1;
        iVar11 = vals[5] - uVar17;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        uVar8 = iVar10 * 8 + 5;
        iVar11 = vals[6] - uVar17;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        iVar12 = vals[7] - uVar17;
        iVar11 = -iVar12;
        if (0 < iVar12) {
          iVar11 = iVar12;
        }
        uVar17 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
        uVar18 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar16 ^ 0x80000000));
        uVar14 = ~uVar17 & uVar15 | uVar14 & uVar17;
        uVar6 = ~uVar18 & uVar16 | uVar6 & uVar18;
        uVar17 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000));
        uVar17 = ~uVar17 & uVar6 | uVar14 & uVar17;
        if (uVar8 <= uVar17) {
          uVar17 = uVar8;
        }
        uVar6 = iVar10 * 8 + 6;
        uVar14 = iVar11 * 8 + 7;
        if (uVar6 < uVar14) {
          uVar14 = uVar6;
        }
        if (uVar14 <= uVar17) {
          uVar17 = uVar14;
        }
        if ((uint)(iVar9 << 3) <= uVar17) {
          uVar17 = iVar9 << 3;
        }
        pixels = pixels | (ulong)(uVar17 & 7) << (bVar4 & 0x3f);
        bVar4 = bVar4 - 3;
      }
      eac_block::set_selector_bits((eac_block *)pDst,pixels);
      return;
    }
    uVar3 = uVar2 | 0x1d00;
  }
  *(ushort *)pDst = uVar3;
  *(undefined4 *)((long)pDst + 2) = 0x92244992;
  *(undefined2 *)((long)pDst + 6) = 0x2449;
  return;
}

Assistant:

void transcode_uastc_to_etc2_eac_a8(unpacked_uastc_block& unpacked_src_blk, color32 block_pixels[4][4], void* pDst)
	{
		eac_block& dst = *static_cast<eac_block*>(pDst);
		const color32* pSrc_pixels = &block_pixels[0][0];

		if ((!g_uastc_mode_has_alpha[unpacked_src_blk.m_mode]) || (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR))
		{
			const uint32_t a = (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR) ? unpacked_src_blk.m_solid_color[3] : 255;

			dst.m_base = a;
			dst.m_table = 13;
			dst.m_multiplier = 1;

			memcpy(dst.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));

			return;
		}

		uint32_t min_a = 255, max_a = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			min_a = basisu::minimum<uint32_t>(min_a, pSrc_pixels[i].a);
			max_a = basisu::maximum<uint32_t>(max_a, pSrc_pixels[i].a);
		}

		if (min_a == max_a)
		{
			dst.m_base = min_a;
			dst.m_table = 13;
			dst.m_multiplier = 1;

			memcpy(dst.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));
			return;
		}

		const uint32_t table = unpacked_src_blk.m_etc2_hints & 0xF;
		const int multiplier = unpacked_src_blk.m_etc2_hints >> 4;

		assert(multiplier >= 1);

		dst.m_multiplier = multiplier;
		dst.m_table = table;

		const float range = (float)(g_eac_modifier_table[dst.m_table][ETC2_EAC_MAX_VALUE_SELECTOR] - g_eac_modifier_table[dst.m_table][ETC2_EAC_MIN_VALUE_SELECTOR]);
		const int center = (int)roundf(basisu::lerp((float)min_a, (float)max_a, (float)(0 - g_eac_modifier_table[dst.m_table][ETC2_EAC_MIN_VALUE_SELECTOR]) / range));

		dst.m_base = center;

		const int8_t* pTable = &g_eac_modifier_table[dst.m_table][0];

		uint32_t vals[8];
		for (uint32_t j = 0; j < 8; j++)
			vals[j] = clamp255(center + (pTable[j] * multiplier));

		uint64_t sels = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t a = block_pixels[i & 3][i >> 2].a;

			const uint32_t err0 = (basisu::iabs(vals[0] - a) << 3) | 0;
			const uint32_t err1 = (basisu::iabs(vals[1] - a) << 3) | 1;
			const uint32_t err2 = (basisu::iabs(vals[2] - a) << 3) | 2;
			const uint32_t err3 = (basisu::iabs(vals[3] - a) << 3) | 3;
			const uint32_t err4 = (basisu::iabs(vals[4] - a) << 3) | 4;
			const uint32_t err5 = (basisu::iabs(vals[5] - a) << 3) | 5;
			const uint32_t err6 = (basisu::iabs(vals[6] - a) << 3) | 6;
			const uint32_t err7 = (basisu::iabs(vals[7] - a) << 3) | 7;

			const uint32_t min_err = basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(err0, err1, err2), err3), err4), err5), err6), err7);

			const uint64_t best_index = min_err & 7;
			sels |= (best_index << (45 - i * 3));
		}

		dst.set_selector_bits(sels);
	}